

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_entry
          (BinBinaryReader *this,Hash *entryKeyHash,Embed *entry)

{
  uint uVar1;
  uint *pos;
  char *pcVar2;
  ushort *pos_00;
  BinCompat *pBVar3;
  byte in_AL;
  char cVar4;
  bool bVar5;
  ssize_t sVar6;
  reference pvVar7;
  size_t in_RCX;
  void *__buf;
  ulong uVar8;
  bool bVar9;
  Type type;
  char *start;
  bool local_5a;
  Type local_59;
  char *local_58;
  Embed *local_50;
  char *local_48;
  ulong local_40;
  BinaryReader *local_38;
  
  pos = (uint *)(this->reader).cur_;
  local_50 = entry;
  if ((this->reader).cap_ < pos + 1) {
    local_5a = fail_msg(this,"reader.read(entryLength)",(char *)pos);
  }
  else {
    uVar1 = *pos;
    (this->reader).cur_ = (char *)(pos + 1);
    local_38 = &this->reader;
    pcVar2 = (this->reader).beg_;
    local_58 = (this->reader).cur_;
    sVar6 = BinaryReader::read(local_38,(int)entryKeyHash,pos,in_RCX);
    if ((char)sVar6 == '\0') {
      local_5a = fail_msg(this,"reader.read(entryKeyHash.value)",local_58);
    }
    else {
      pos_00 = (ushort *)(this->reader).cur_;
      if ((this->reader).cap_ < pos_00 + 1) {
        local_5a = fail_msg(this,"reader.read(count)",(char *)pos_00);
      }
      else {
        uVar8 = (ulong)*pos_00;
        (this->reader).cur_ = (char *)(pos_00 + 1);
        bVar9 = uVar8 == 0;
        local_5a = (bool)in_AL;
        local_48 = pcVar2;
        local_40 = (ulong)uVar1;
        if (!bVar9) {
          local_50 = (Embed *)&local_50->items;
          do {
            pvVar7 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                               ((vector<ritobin::Field,_std::allocator<ritobin::Field>_> *)local_50)
            ;
            local_59 = NONE;
            pcVar2 = (this->reader).cur_;
            sVar6 = BinaryReader::read(local_38,(int)pvVar7,__buf,in_RCX);
            if ((char)sVar6 == '\0') {
              local_5a = fail_msg(this,"reader.read(name)",pcVar2);
LAB_0010ffd3:
              bVar5 = false;
            }
            else {
              pcVar2 = (this->reader).cur_;
              if ((this->reader).cap_ < pcVar2 + 1) {
                in_RCX = 0;
                cVar4 = '\0';
              }
              else {
                cVar4 = *pcVar2;
                in_RCX = CONCAT71((int7)(in_RCX >> 8),cVar4);
                (this->reader).cur_ = pcVar2 + 1;
                pBVar3 = (this->reader).compat_;
                cVar4 = (**(code **)(*(long *)pBVar3 + 0x10))(pBVar3,cVar4,&local_59);
              }
              if (cVar4 == '\0') {
                local_5a = fail_msg(this,"reader.read(type)",pcVar2);
                goto LAB_0010ffd3;
              }
              pcVar2 = (this->reader).cur_;
              bVar5 = read_value_of(this,&pvVar7->value,local_59);
              if (!bVar5) {
                local_5a = fail_msg(this,"read_value_of(item, type)",pcVar2);
              }
            }
            if (bVar5 == false) break;
            uVar8 = uVar8 - 1;
            bVar9 = uVar8 == 0;
          } while (!bVar9);
        }
        if ((bVar9) &&
           (local_5a = true,
           (this->reader).cur_ + -(long)(this->reader).beg_ !=
           local_58 + (local_40 - (long)local_48))) {
          local_5a = fail_msg(this,"reader.position() == position + entryLength",(this->reader).cur_
                             );
        }
      }
    }
  }
  return (bool)(local_5a & 1);
}

Assistant:

bool read_entry(Hash& entryKeyHash, Embed& entry) noexcept {
            uint32_t entryLength = 0;
            uint16_t count = 0;
            bin_assert(reader.read(entryLength));
            size_t position = reader.position();
            bin_assert(reader.read(entryKeyHash.value));
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = entry.items.emplace_back();
                Type type = {};
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + entryLength);
            return true;
        }